

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backed_block.cpp
# Opt level: O2

int backed_block_add_file(backed_block_list *bbl,char *filename,int64_t offset,uint len,uint block)

{
  int iVar1;
  backed_block *new_bb;
  char *pcVar2;
  
  new_bb = (backed_block *)calloc(1,0x28);
  if (new_bb == (backed_block *)0x0) {
    iVar1 = -0xc;
  }
  else {
    new_bb->block = block;
    new_bb->len = len;
    new_bb->type = BACKED_BLOCK_FILE;
    pcVar2 = strdup(filename);
    (new_bb->field_3).file.filename = pcVar2;
    (new_bb->field_3).file.offset = offset;
    queue_bb(bbl,new_bb);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int backed_block_add_file(struct backed_block_list* bbl, const char* filename, int64_t offset,
                          unsigned int len, unsigned int block) {
  struct backed_block* bb = reinterpret_cast<backed_block*>(calloc(1, sizeof(struct backed_block)));
  if (bb == nullptr) {
    return -ENOMEM;
  }

  bb->block = block;
  bb->len = len;
  bb->type = BACKED_BLOCK_FILE;
  bb->file.filename = strdup(filename);
  bb->file.offset = offset;
  bb->next = nullptr;

  return queue_bb(bbl, bb);
}